

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QCborMap *m)

{
  ulong uVar1;
  QCborContainerPrivate *this;
  DataPointer *pDVar2;
  undefined8 this_00;
  storage_type *in_RCX;
  undefined8 *in_RDX;
  char *pcVar3;
  QString *this_01;
  Stream *this_02;
  QCborContainerPrivate *pQVar4;
  ulong idx;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  QDebugStateSaver local_70;
  QCborValue local_68;
  QCborValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_70,(QDebug *)m);
  pQVar4 = (m->d).d.ptr;
  *(undefined1 *)&(pQVar4->elements).d.ptr = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QCborMap{";
  QString::fromUtf8((QString *)&local_50,(QString *)0x9,ba);
  QTextStream::operator<<((QTextStream *)pQVar4,(QString *)&local_50);
  if ((QArrayData *)local_50.n != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_50.n,2,0x10);
    }
  }
  pQVar4 = (m->d).d.ptr;
  if (*(char *)&(pQVar4->elements).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
  }
  pQVar4 = (QCborContainerPrivate *)*in_RDX;
  if ((pQVar4 != (QCborContainerPrivate *)0x0) && (uVar1 = (pQVar4->elements).d.size, 1 < uVar1)) {
    idx = 1;
    pcVar3 = "{";
    do {
      this = (m->d).d.ptr;
      this_01 = (QString *)0xffffffffffffffff;
      do {
        pDVar2 = &this_01->d;
        this_01 = (QString *)((long)&(this_01->d).d + 1);
      } while ((pcVar3 + 1)[(long)&pDVar2->d] != '\0');
      ba_00.m_data = in_RCX;
      ba_00.m_size = (qsizetype)pcVar3;
      QString::fromUtf8((QString *)&local_50,this_01,ba_00);
      QTextStream::operator<<((QTextStream *)this,(QString *)&local_50);
      if ((QArrayData *)local_50.n != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_50.n,2,0x10);
        }
      }
      this_02 = (Stream *)(m->d).d.ptr;
      if (this_02->space == true) {
        QTextStream::operator<<((QTextStream *)this_02,' ');
        this_02 = (Stream *)(m->d).d.ptr;
      }
      *(int *)&(((QList<QtCbor::Element> *)&this_02->ref)->d).d =
           *(int *)&(((QList<QtCbor::Element> *)&this_02->ref)->d).d + 1;
      local_90._0_8_ = this_02;
      QCborContainerPrivate::valueAt(&local_68,pQVar4,idx - 1);
      operator<<((Stream *)(local_90 + 8),(QCborValue *)local_90);
      this_00 = local_90._8_8_;
      ba_01.m_data = in_RCX;
      ba_01.m_size = (qsizetype)", ";
      QString::fromUtf8((QString *)&local_50,(QString *)0x2,ba_01);
      QTextStream::operator<<((QTextStream *)this_00,(QString *)&local_50);
      if ((QArrayData *)local_50.n != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_50.n,2,0x10);
        }
      }
      if (*(char *)(local_90._8_8_ + 0x30) == '\x01') {
        QTextStream::operator<<((QTextStream *)local_90._8_8_,' ');
      }
      local_80._0_8_ = local_90._8_8_;
      *(int *)&(((QList<QtCbor::Element> *)(local_90._8_8_ + 0x28))->d).d =
           *(int *)&(((QList<QtCbor::Element> *)(local_90._8_8_ + 0x28))->d).d + 1;
      QCborContainerPrivate::valueAt(&local_50,pQVar4,idx);
      operator<<((Stream *)(local_80 + 8),(QCborValue *)local_80);
      QTextStream::operator<<((QTextStream *)local_80._8_8_,'}');
      if (*(char *)&(((QList<QtCbor::Element> *)(local_80._8_8_ + 0x28))->d).ptr == '\x01') {
        QTextStream::operator<<((QTextStream *)local_80._8_8_,' ');
      }
      QDebug::~QDebug((QDebug *)(local_80 + 8));
      if (local_50.container != (QCborContainerPrivate *)0x0) {
        QCborContainerPrivate::deref(local_50.container);
      }
      QDebug::~QDebug((QDebug *)local_80);
      QDebug::~QDebug((QDebug *)(local_90 + 8));
      if (local_68.container != (QCborContainerPrivate *)0x0) {
        QCborContainerPrivate::deref(local_68.container);
      }
      QDebug::~QDebug((QDebug *)local_90);
      idx = idx + 2;
      pcVar3 = ", {";
    } while (idx != (uVar1 | 1));
  }
  QTextStream::operator<<((QTextStream *)(m->d).d.ptr,'}');
  pQVar4 = (m->d).d.ptr;
  if (*(char *)&(pQVar4->elements).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
    pQVar4 = (m->d).d.ptr;
  }
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar4;
  *(int *)&(pQVar4->elements).d.d = *(int *)&(pQVar4->elements).d.d + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QCborMap &m)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QCborMap{";
    const char *open = "{";
    for (auto pair : m) {
        dbg << open << pair.first <<  ", " << pair.second << '}';
        open = ", {";
    }
    return dbg << '}';
}